

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_add_element(p_ply_conflict ply,char *name,long ninstances)

{
  size_t sVar1;
  p_ply_element_conflict __dest;
  long in_RDX;
  char *in_RSI;
  p_ply_conflict in_RDI;
  p_ply_element_conflict element;
  p_ply_conflict ply_00;
  int local_4;
  
  ply_00 = (p_ply_conflict)0x0;
  sVar1 = strlen(in_RSI);
  if ((sVar1 < 0x100) && (-1 < in_RDX)) {
    __dest = ply_grow_element(ply_00);
    if (__dest == (p_ply_element_conflict)0x0) {
      local_4 = 0;
    }
    else {
      strcpy(__dest->name,in_RSI);
      __dest->ninstances = in_RDX;
      local_4 = 1;
    }
  }
  else {
    ply_ferror(in_RDI,"Invalid arguments");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ply_add_element(p_ply ply, const char *name, long ninstances) {
    p_ply_element element = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE && ninstances >= 0);
    if (strlen(name) >= WORDSIZE || ninstances < 0) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = ply_grow_element(ply);
    if (!element) return 0;
    strcpy(element->name, name);
    element->ninstances = ninstances;
    return 1;
}